

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepper.cpp
# Opt level: O3

void __thiscall QtMWidgets::Stepper::mouseReleaseEvent(Stepper *this,QMouseEvent *event)

{
  int iVar1;
  
  iVar1 = *(int *)(event + 0x40);
  if (iVar1 == 1) {
    ((this->d).d)->button = NoButton;
    QTimer::stop();
  }
  event[0xc] = (QMouseEvent)(iVar1 == 1);
  return;
}

Assistant:

void
Stepper::mouseReleaseEvent( QMouseEvent * event )
{
	if( event->button() == Qt::LeftButton )
	{
		d->button = StepperPrivate::NoButton;

		d->timer->stop();

		event->accept();
	}
	else
		event->ignore();
}